

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

int uv_fs_close(uv_loop_t *loop,uv_fs_t *req,uv_file file,uv_fs_cb cb)

{
  int iVar1;
  int iVar2;
  
  if (req == (uv_fs_t *)0x0) {
    iVar2 = -0x16;
  }
  else {
    req->type = UV_FS;
    req->fs_type = UV_FS_CLOSE;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    iVar2 = 0;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    req->file = file;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(&req->work_req);
      iVar2 = (int)req->result;
    }
    else {
      iVar1 = uv__iou_fs_close(loop,req);
      if (iVar1 == 0) {
        (loop->active_reqs).count = (loop->active_reqs).count + 1;
        uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
      }
    }
  }
  return iVar2;
}

Assistant:

int uv_fs_close(uv_loop_t* loop, uv_fs_t* req, uv_file file, uv_fs_cb cb) {
  INIT(CLOSE);
  req->file = file;
  if (cb != NULL)
    if (uv__iou_fs_close(loop, req))
      return 0;
  POST;
}